

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msbuild_objectmodel.cpp
# Opt level: O1

ssize_t __thiscall VCXProjectWriter::write(VCXProjectWriter *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  long lVar2;
  QArrayData *pQVar3;
  QArrayData *pQVar4;
  XmlOutput *pXVar5;
  triState tVar6;
  long lVar7;
  undefined4 in_register_00000034;
  storage_type *psVar8;
  Data *pDVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  QArrayData *pQVar11;
  QArrayData *pQVar12;
  QArrayData *pQVar13;
  QArrayData *pQVar14;
  QArrayData *pQVar15;
  QArrayData *pQVar16;
  QArrayData *pQVar17;
  QArrayData *pQVar18;
  QArrayData *pQVar19;
  QArrayData *pQVar20;
  QArrayData *pQVar21;
  QArrayData *pQVar22;
  QArrayData *pQVar23;
  QArrayData *pQVar24;
  QArrayData *pQVar25;
  QArrayData *pQVar26;
  Data *pDVar27;
  QByteArrayView QVar28;
  QByteArrayView QVar29;
  QByteArrayView QVar30;
  QByteArrayView QVar31;
  QByteArrayView QVar32;
  QByteArrayView QVar33;
  QByteArrayView QVar34;
  QByteArrayView QVar35;
  QByteArrayView QVar36;
  QByteArrayView QVar37;
  QByteArrayView QVar38;
  QByteArrayView QVar39;
  QByteArrayView QVar40;
  QByteArrayView QVar41;
  QByteArrayView QVar42;
  QByteArrayView QVar43;
  QByteArrayView QVar44;
  QByteArrayView QVar45;
  QByteArrayView QVar46;
  QByteArrayView QVar47;
  QByteArrayView QVar48;
  QByteArrayView QVar49;
  QByteArrayView QVar50;
  QByteArrayView QVar51;
  QByteArrayView QVar52;
  QByteArrayView QVar53;
  QByteArrayView QVar54;
  QByteArrayView QVar55;
  QByteArrayView QVar56;
  QByteArrayView QVar57;
  QByteArrayView QVar58;
  QByteArrayView QVar59;
  QByteArrayView QVar60;
  QByteArrayView QVar61;
  QByteArrayView QVar62;
  QLatin1String QVar63;
  QByteArrayView QVar64;
  QByteArrayView QVar65;
  QByteArrayView QVar66;
  QByteArrayView QVar67;
  QByteArrayView QVar68;
  QByteArrayView QVar69;
  QByteArrayView QVar70;
  QByteArrayView QVar71;
  QByteArrayView QVar72;
  QByteArrayView QVar73;
  QByteArrayView QVar74;
  QLatin1String QVar75;
  QStringList result;
  xml_output local_1060;
  undefined1 local_1028 [16];
  Data *pDStack_1018;
  undefined1 local_1010 [16];
  undefined1 local_1000 [16];
  xml_output local_ff0;
  undefined1 local_fb8 [16];
  Data *local_fa8;
  undefined1 auStack_fa0 [16];
  undefined1 auStack_f90 [24];
  xml_output local_f78;
  xml_output local_f40;
  xml_output local_f08;
  xml_output local_ed0;
  xml_output local_e98;
  xml_output local_e60;
  xml_output local_e28;
  xml_output local_df0;
  undefined1 local_db8 [16];
  Data *local_da8;
  undefined1 auStack_da0 [16];
  undefined1 auStack_d90 [24];
  xml_output local_d78;
  xml_output local_d40;
  xml_output local_d08;
  xml_output local_cd0;
  undefined1 local_c98 [16];
  Data *local_c88;
  undefined1 auStack_c80 [16];
  undefined1 auStack_c70 [16];
  undefined1 local_c60 [16];
  Data *pDStack_c50;
  undefined1 local_c48 [16];
  undefined1 local_c38 [16];
  undefined1 local_c28 [16];
  Data *pDStack_c18;
  undefined1 local_c10 [16];
  undefined1 local_c00 [16];
  xml_output local_bf0;
  xml_output local_bb8;
  undefined1 local_b80 [16];
  Data *pDStack_b70;
  undefined1 local_b68 [16];
  undefined1 local_b58 [16];
  undefined1 local_b48 [16];
  qsizetype local_b38;
  xml_output local_b28;
  xml_output local_af0;
  undefined1 local_ab8 [16];
  Data *pDStack_aa8;
  undefined1 local_aa0 [16];
  undefined1 local_a90 [16];
  undefined1 local_a80 [16];
  Data *pDStack_a70;
  undefined1 local_a68 [16];
  undefined1 local_a58 [16];
  undefined1 local_a48 [16];
  Data *local_a38;
  undefined1 auStack_a30 [16];
  undefined1 auStack_a20 [24];
  undefined1 local_a08 [16];
  Data *local_9f8;
  undefined1 auStack_9f0 [16];
  undefined1 auStack_9e0 [16];
  xml_output local_9d0;
  xml_output local_998;
  xml_output local_960;
  undefined1 local_928 [16];
  Data *pDStack_918;
  undefined1 local_910 [16];
  undefined1 local_900 [16];
  undefined1 local_8f0 [16];
  Data *pDStack_8e0;
  undefined1 local_8d8 [16];
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  Data *pDStack_8a8;
  undefined1 local_8a0 [16];
  undefined1 local_890 [16];
  xml_output local_880;
  xml_output local_848;
  xml_output local_810;
  undefined1 local_7d8 [16];
  Data *local_7c8;
  undefined1 auStack_7c0 [16];
  undefined1 auStack_7b0 [24];
  xml_output local_798;
  xml_output local_760;
  xml_output local_728;
  xml_output local_6f0;
  xml_output local_6b8;
  xml_output local_680;
  undefined1 local_648 [16];
  Data *local_638;
  undefined1 auStack_630 [16];
  undefined1 auStack_620 [16];
  xml_output local_610;
  undefined1 local_5d8 [16];
  Data *local_5c8;
  undefined1 auStack_5c0 [16];
  undefined1 auStack_5b0 [16];
  xml_output local_5a0;
  undefined1 local_568 [16];
  Data *local_558;
  undefined1 auStack_550 [16];
  undefined1 auStack_540 [16];
  undefined1 local_530 [16];
  Data *pDStack_520;
  undefined1 local_518 [16];
  undefined1 local_508 [16];
  xml_output local_4f8;
  xml_output local_4c0;
  undefined1 local_488 [16];
  Data *local_478;
  undefined1 auStack_470 [16];
  undefined1 auStack_460 [24];
  xml_output local_448;
  xml_output local_410;
  undefined1 local_3d8 [16];
  Data *local_3c8;
  undefined1 auStack_3c0 [16];
  undefined1 auStack_3b0 [24];
  xml_output local_398;
  xml_output local_360;
  undefined1 local_328 [16];
  Data *local_318;
  undefined1 auStack_310 [16];
  undefined1 auStack_300 [24];
  undefined1 local_2e8 [16];
  Data *local_2d8;
  undefined1 auStack_2d0 [16];
  undefined1 auStack_2c0 [24];
  undefined1 local_2a8 [16];
  Data *local_298;
  undefined1 auStack_290 [16];
  undefined1 auStack_280 [16];
  xml_output local_270;
  undefined1 local_238 [16];
  Data *pDStack_228;
  undefined1 local_220 [16];
  undefined1 local_210 [16];
  xml_output local_200;
  undefined1 local_1c8 [16];
  Data *local_1b8;
  undefined1 auStack_1b0 [16];
  undefined1 auStack_1a0 [24];
  undefined1 local_188 [16];
  Data *local_178;
  undefined1 auStack_170 [16];
  undefined1 auStack_160 [16];
  undefined1 local_150 [16];
  Data *pDStack_140;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  xml_output local_118;
  xml_output local_e0;
  xml_output local_a8;
  undefined1 local_70 [48];
  qsizetype local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QVar28.m_data = (storage_type *)0x9;
  QVar28.m_size = (qsizetype)local_70;
  QString::fromUtf8(QVar28);
  local_70._24_8_ = local_70._16_8_;
  pQVar4 = (QArrayData *)CONCAT44(local_70._4_4_,local_70._0_4_);
  local_70._0_4_ = tTag;
  local_70._16_8_ = local_70._8_8_;
  if (pQVar4 != (QArrayData *)0x0) {
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_70._32_16_ = (undefined1  [16])0x0;
  local_40 = 0;
  local_70._8_8_ = pQVar4;
  pXVar5 = XmlOutput::operator<<
                     ((XmlOutput *)CONCAT44(in_register_00000034,__fd),(xml_output *)local_70);
  attrTagX(&local_a8,"AdditionalIncludeDirectories",(QStringList *)((long)__buf + 8),";");
  pXVar5 = XmlOutput::operator<<(pXVar5,&local_a8);
  attrTagX(&local_e0,"AdditionalOptions",(QStringList *)((long)__buf + 0x20)," ");
  pXVar5 = XmlOutput::operator<<(pXVar5,&local_e0);
  attrTagX(&local_118,"AdditionalUsingDirectories",(QStringList *)((long)__buf + 0x38),";");
  pXVar5 = XmlOutput::operator<<(pXVar5,&local_118);
  if (*(long *)((long)__buf + 0x60) == 0) {
    local_150._0_4_ = tNothing;
    stack0xfffffffffffffeb8 = (undefined1  [16])0x0;
    local_138 = (undefined1  [16])0x0;
    local_128 = (undefined1  [16])0x0;
  }
  else {
    QVar29.m_data = (storage_type *)0x18;
    QVar29.m_size = (qsizetype)local_150;
    QString::fromUtf8(QVar29);
    pQVar11 = (QArrayData *)CONCAT44(local_150._4_4_,local_150._0_4_);
    local_138._0_8_ = pDStack_140;
    local_150._0_4_ = tTagValue;
    pDStack_140 = (Data *)local_150._8_8_;
    local_150._8_8_ = pQVar11;
    if (pQVar11 != (QArrayData *)0x0) {
      LOCK();
      (pQVar11->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar11->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_138._8_8_ = *(undefined8 *)((long)__buf + 0x50);
    local_128 = *(undefined1 (*) [16])((long)__buf + 0x58);
    if ((int *)local_138._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_138._8_8_ = *(int *)local_138._8_8_ + 1;
      UNLOCK();
    }
    if (pQVar11 != (QArrayData *)0x0) {
      LOCK();
      (pQVar11->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar11->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar11->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar11,2,0x10);
      }
    }
  }
  pXVar5 = XmlOutput::operator<<(pXVar5,(xml_output *)local_150);
  switch(*(undefined4 *)((long)__buf + 0x68)) {
  case 1:
    psVar8 = &DAT_0000000c;
    break;
  case 2:
    psVar8 = (storage_type *)0x3;
    break;
  case 3:
    psVar8 = (storage_type *)0x16;
    break;
  case 4:
    psVar8 = (storage_type *)0x15;
    break;
  default:
    pQVar11 = (QArrayData *)0x0;
    auStack_160._8_8_ = (char16_t *)0x0;
    auStack_160._0_8_ = (Data *)0x0;
    goto LAB_001f3102;
  }
  QVar30.m_data = psVar8;
  QVar30.m_size = (qsizetype)local_188;
  QString::fromUtf8(QVar30);
  pQVar11 = (QArrayData *)CONCAT44(local_188._4_4_,local_188._0_4_);
  auStack_160._8_8_ = local_178;
  auStack_160._0_8_ = local_188._8_8_;
LAB_001f3102:
  if ((char16_t *)auStack_160._8_8_ == (char16_t *)0x0) {
    local_188._0_4_ = tNothing;
    stack0xfffffffffffffe80 = (undefined1  [16])0x0;
    auStack_170 = (undefined1  [16])0x0;
    auStack_160 = (undefined1  [16])0x0;
  }
  else {
    QVar31.m_data = (storage_type *)0xf;
    QVar31.m_size = (qsizetype)local_188;
    QString::fromUtf8(QVar31);
    pQVar12 = (QArrayData *)CONCAT44(local_188._4_4_,local_188._0_4_);
    auStack_170._0_8_ = local_178;
    local_188._0_4_ = tTagValue;
    local_178 = (Data *)local_188._8_8_;
    local_188._8_8_ = pQVar12;
    if (pQVar12 != (QArrayData *)0x0) {
      LOCK();
      (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    auStack_170._8_8_ = pQVar11;
    if (pQVar11 != (QArrayData *)0x0) {
      LOCK();
      (pQVar11->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar11->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (pQVar12 != (QArrayData *)0x0) {
      LOCK();
      (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar12->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar12,2,0x10);
      }
    }
  }
  pXVar5 = XmlOutput::operator<<(pXVar5,(xml_output *)local_188);
  switch(*(undefined4 *)((long)__buf + 0x6c)) {
  case 0:
    psVar8 = (storage_type *)0x0;
    break;
  case 1:
    psVar8 = (storage_type *)0x16;
    break;
  case 2:
    psVar8 = (storage_type *)0x1c;
    break;
  case 3:
    psVar8 = (storage_type *)0x10;
    break;
  default:
    pQVar12 = (QArrayData *)0x0;
    auStack_1a0._8_8_ = (char16_t *)0x0;
    auStack_1a0._0_8_ = (Data *)0x0;
    goto LAB_001f325b;
  }
  QVar32.m_size = local_1c8;
  QVar32.m_data = psVar8;
  QString::fromUtf8(QVar32);
  pQVar12 = (QArrayData *)CONCAT44(local_1c8._4_4_,local_1c8._0_4_);
  auStack_1a0._8_8_ = local_1b8;
  auStack_1a0._0_8_ = local_1c8._8_8_;
LAB_001f325b:
  if ((char16_t *)auStack_1a0._8_8_ == (char16_t *)0x0) {
    local_1c8._0_4_ = tNothing;
    stack0xfffffffffffffe40 = (undefined1  [16])0x0;
    auStack_1b0 = (undefined1  [16])0x0;
    auStack_1a0._0_16_ = (undefined1  [16])0x0;
  }
  else {
    QVar33.m_data = (storage_type *)0x12;
    QVar33.m_size = (qsizetype)local_1c8;
    QString::fromUtf8(QVar33);
    pQVar13 = (QArrayData *)CONCAT44(local_1c8._4_4_,local_1c8._0_4_);
    auStack_1b0._0_8_ = local_1b8;
    local_1c8._0_4_ = tTagValue;
    local_1b8 = (Data *)local_1c8._8_8_;
    local_1c8._8_8_ = pQVar13;
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    auStack_1b0._8_8_ = pQVar12;
    if (pQVar12 != (QArrayData *)0x0) {
      LOCK();
      (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar13->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar13,2,0x10);
      }
    }
  }
  pXVar5 = XmlOutput::operator<<(pXVar5,(xml_output *)local_1c8);
  tVar6 = unset;
  if ((ulong)*(uint *)((long)__buf + 0x70) < 3) {
    tVar6 = *(triState *)(&DAT_002adc50 + (ulong)*(uint *)((long)__buf + 0x70) * 4);
  }
  attrTagT(&local_200,"BrowseInformation",tVar6);
  pXVar5 = XmlOutput::operator<<(pXVar5,&local_200);
  if (*(long *)((long)__buf + 0x88) == 0) {
    local_238._0_4_ = tNothing;
    stack0xfffffffffffffdd0 = (undefined1  [16])0x0;
    local_220 = (undefined1  [16])0x0;
    local_210 = (undefined1  [16])0x0;
  }
  else {
    QVar34.m_data = (storage_type *)0x15;
    QVar34.m_size = (qsizetype)local_238;
    QString::fromUtf8(QVar34);
    pQVar13 = (QArrayData *)CONCAT44(local_238._4_4_,local_238._0_4_);
    local_220._0_8_ = pDStack_228;
    local_238._0_4_ = tTagValue;
    pDStack_228 = (Data *)local_238._8_8_;
    local_238._8_8_ = pQVar13;
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_220._8_8_ = *(undefined8 *)((long)__buf + 0x78);
    local_210 = *(undefined1 (*) [16])((long)__buf + 0x80);
    if ((int *)local_220._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_220._8_8_ = *(int *)local_220._8_8_ + 1;
      UNLOCK();
    }
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar13->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar13,2,0x10);
      }
    }
  }
  pXVar5 = XmlOutput::operator<<(pXVar5,(xml_output *)local_238);
  attrTagT(&local_270,"BufferSecurityCheck",*(triState *)((long)__buf + 0x90));
  pXVar5 = XmlOutput::operator<<(pXVar5,&local_270);
  iVar1 = *(int *)((long)__buf + 0x94);
  if (iVar1 == 2) {
    psVar8 = (storage_type *)0x7;
LAB_001f34c3:
    QVar35.m_data = psVar8;
    QVar35.m_size = (qsizetype)local_2a8;
    QString::fromUtf8(QVar35);
    pQVar13 = (QArrayData *)CONCAT44(local_2a8._4_4_,local_2a8._0_4_);
    auStack_280._8_8_ = local_298;
    auStack_280._0_8_ = local_2a8._8_8_;
  }
  else {
    if (iVar1 == 1) {
      psVar8 = &DAT_00000008;
      goto LAB_001f34c3;
    }
    if (iVar1 == 0) {
      psVar8 = (storage_type *)0x5;
      goto LAB_001f34c3;
    }
    pQVar13 = (QArrayData *)0x0;
    auStack_280._0_8_ = (Data *)0x0;
    auStack_280._8_8_ = (char16_t *)0x0;
  }
  if ((char16_t *)auStack_280._8_8_ == (char16_t *)0x0) {
    local_2a8._0_4_ = tNothing;
    stack0xfffffffffffffd60 = (undefined1  [16])0x0;
    auStack_290 = (undefined1  [16])0x0;
    auStack_280 = (undefined1  [16])0x0;
  }
  else {
    QVar36.m_data = (storage_type *)0x11;
    QVar36.m_size = (qsizetype)local_2a8;
    QString::fromUtf8(QVar36);
    pQVar14 = (QArrayData *)CONCAT44(local_2a8._4_4_,local_2a8._0_4_);
    auStack_290._0_8_ = local_298;
    local_2a8._0_4_ = tTagValue;
    local_298 = (Data *)local_2a8._8_8_;
    local_2a8._8_8_ = pQVar14;
    if (pQVar14 != (QArrayData *)0x0) {
      LOCK();
      (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    auStack_290._8_8_ = pQVar13;
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (pQVar14 != (QArrayData *)0x0) {
      LOCK();
      (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar14->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar14,2,0x10);
      }
    }
  }
  pXVar5 = XmlOutput::operator<<(pXVar5,(xml_output *)local_2a8);
  if (*(int *)((long)__buf + 0x98) == 2) {
    psVar8 = &DAT_0000000c;
LAB_001f35ea:
    QVar37.m_data = psVar8;
    QVar37.m_size = (qsizetype)local_2e8;
    QString::fromUtf8(QVar37);
    pQVar14 = (QArrayData *)CONCAT44(local_2e8._4_4_,local_2e8._0_4_);
    auStack_2c0._8_8_ = local_2d8;
    auStack_2c0._0_8_ = local_2e8._8_8_;
  }
  else {
    if (*(int *)((long)__buf + 0x98) == 1) {
      psVar8 = (storage_type *)0xa;
      goto LAB_001f35ea;
    }
    pQVar14 = (QArrayData *)0x0;
    auStack_2c0._0_8_ = (Data *)0x0;
    auStack_2c0._8_8_ = (char16_t *)0x0;
  }
  if ((char16_t *)auStack_2c0._8_8_ == (char16_t *)0x0) {
    local_2e8._0_4_ = tNothing;
    stack0xfffffffffffffd20 = (undefined1  [16])0x0;
    auStack_2d0 = (undefined1  [16])0x0;
    auStack_2c0._0_16_ = (undefined1  [16])0x0;
  }
  else {
    QVar38.m_data = (storage_type *)0x9;
    QVar38.m_size = (qsizetype)local_2e8;
    QString::fromUtf8(QVar38);
    pQVar15 = (QArrayData *)CONCAT44(local_2e8._4_4_,local_2e8._0_4_);
    auStack_2d0._0_8_ = local_2d8;
    local_2e8._0_4_ = tTagValue;
    local_2d8 = (Data *)local_2e8._8_8_;
    local_2e8._8_8_ = pQVar15;
    if (pQVar15 != (QArrayData *)0x0) {
      LOCK();
      (pQVar15->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar15->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    auStack_2d0._8_8_ = pQVar14;
    if (pQVar14 != (QArrayData *)0x0) {
      LOCK();
      (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (pQVar15 != (QArrayData *)0x0) {
      LOCK();
      (pQVar15->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar15->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar15->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar15,2,0x10);
      }
    }
  }
  pXVar5 = XmlOutput::operator<<(pXVar5,(xml_output *)local_2e8);
  iVar1 = *(int *)((long)__buf + 0x9c);
  if (iVar1 == 4) {
    psVar8 = (storage_type *)0x9;
LAB_001f372a:
    QVar39.m_data = psVar8;
    QVar39.m_size = (qsizetype)local_328;
    QString::fromUtf8(QVar39);
    pQVar15 = (QArrayData *)CONCAT44(local_328._4_4_,local_328._0_4_);
    auStack_300._8_8_ = local_318;
    auStack_300._0_8_ = local_328._8_8_;
  }
  else {
    if ((iVar1 == 2) || (iVar1 == 1)) {
      psVar8 = (storage_type *)0x4;
      goto LAB_001f372a;
    }
    pQVar15 = (QArrayData *)0x0;
    auStack_300._0_8_ = (Data *)0x0;
    auStack_300._8_8_ = (char16_t *)0x0;
  }
  if ((char16_t *)auStack_300._8_8_ == (char16_t *)0x0) {
    local_328._0_4_ = tNothing;
    stack0xfffffffffffffce0 = (undefined1  [16])0x0;
    auStack_310 = (undefined1  [16])0x0;
    auStack_300._0_16_ = (undefined1  [16])0x0;
  }
  else {
    QVar40.m_data = (storage_type *)0x10;
    QVar40.m_size = (qsizetype)local_328;
    QString::fromUtf8(QVar40);
    pQVar16 = (QArrayData *)CONCAT44(local_328._4_4_,local_328._0_4_);
    auStack_310._0_8_ = local_318;
    local_328._0_4_ = tTagValue;
    local_318 = (Data *)local_328._8_8_;
    local_328._8_8_ = pQVar16;
    if (pQVar16 != (QArrayData *)0x0) {
      LOCK();
      (pQVar16->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar16->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    auStack_310._8_8_ = pQVar15;
    if (pQVar15 != (QArrayData *)0x0) {
      LOCK();
      (pQVar15->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar15->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (pQVar16 != (QArrayData *)0x0) {
      LOCK();
      (pQVar16->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar16->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar16->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar16,2,0x10);
      }
    }
  }
  pXVar5 = XmlOutput::operator<<(pXVar5,(xml_output *)local_328);
  attrTagT(&local_360,"CompileAsWinRT",*(triState *)((long)__buf + 0xa0));
  pXVar5 = XmlOutput::operator<<(pXVar5,&local_360);
  attrTagT(&local_398,"CreateHotpatchableImage",*(triState *)((long)__buf + 0x2f8));
  pXVar5 = XmlOutput::operator<<(pXVar5,&local_398);
  pQVar16 = (QArrayData *)0x0;
  pDVar27 = (Data *)0x0;
  pDVar9 = (Data *)(char16_t *)0x0;
  switch(*(undefined4 *)((long)__buf + 0xa8)) {
  case 0:
    if (0xa0 < *(int *)(*(long *)((long)__buf + 0x318) + 4)) {
      psVar8 = (storage_type *)0x4;
      goto LAB_001f38f5;
    }
    pDVar9 = (Data *)0x0;
    break;
  case 1:
    psVar8 = &DAT_00000008;
    goto LAB_001f38f5;
  case 3:
    goto LAB_001f38e8;
  case 4:
LAB_001f38e8:
    psVar8 = (storage_type *)0xf;
LAB_001f38f5:
    QVar41.m_data = psVar8;
    QVar41.m_size = (qsizetype)local_3d8;
    QString::fromUtf8(QVar41);
    pQVar16 = (QArrayData *)CONCAT44(local_3d8._4_4_,local_3d8._0_4_);
    pDVar9 = local_3c8;
    pDVar27 = (Data *)local_3d8._8_8_;
  }
  if (pDVar9 == (Data *)0x0) {
    local_3d8._0_4_ = tNothing;
    stack0xfffffffffffffc30 = (undefined1  [16])0x0;
    auStack_3c0 = (undefined1  [16])0x0;
    auStack_3b0._0_16_ = (undefined1  [16])0x0;
  }
  else {
    QVar42.m_data = (storage_type *)0x16;
    QVar42.m_size = (qsizetype)local_3d8;
    QString::fromUtf8(QVar42);
    pQVar17 = (QArrayData *)CONCAT44(local_3d8._4_4_,local_3d8._0_4_);
    auStack_3c0._0_8_ = local_3c8;
    local_3d8._0_4_ = tTagValue;
    local_3c8 = (Data *)local_3d8._8_8_;
    local_3d8._8_8_ = pQVar17;
    if (pQVar17 != (QArrayData *)0x0) {
      LOCK();
      (pQVar17->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar17->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    auStack_3c0._8_8_ = pQVar16;
    auStack_3b0._8_8_ = pDVar9;
    auStack_3b0._0_8_ = pDVar27;
    if (pQVar16 != (QArrayData *)0x0) {
      LOCK();
      (pQVar16->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar16->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (pQVar17 != (QArrayData *)0x0) {
      LOCK();
      (pQVar17->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar17->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar17->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar17,2,0x10);
      }
    }
  }
  pXVar5 = XmlOutput::operator<<(pXVar5,(xml_output *)local_3d8);
  attrTagT(&local_410,"DisableLanguageExtensions",*(triState *)((long)__buf + 0xb4));
  pXVar5 = XmlOutput::operator<<(pXVar5,&local_410);
  attrTagX(&local_448,"DisableSpecificWarnings",(QStringList *)((long)__buf + 0xb8),";");
  pXVar5 = XmlOutput::operator<<(pXVar5,&local_448);
  if (*(int *)((long)__buf + 0xd0) == 2) {
    psVar8 = (storage_type *)0x18;
LAB_001f3a83:
    QVar43.m_data = psVar8;
    QVar43.m_size = (qsizetype)local_488;
    QString::fromUtf8(QVar43);
    pQVar17 = (QArrayData *)CONCAT44(local_488._4_4_,local_488._0_4_);
    auStack_460._8_8_ = local_478;
    auStack_460._0_8_ = local_488._8_8_;
  }
  else {
    if (*(int *)((long)__buf + 0xd0) == 1) {
      psVar8 = (storage_type *)0x17;
      goto LAB_001f3a83;
    }
    pQVar17 = (QArrayData *)0x0;
    auStack_460._0_8_ = (Data *)0x0;
    auStack_460._8_8_ = (char16_t *)0x0;
  }
  if ((char16_t *)auStack_460._8_8_ == (char16_t *)0x0) {
    local_488._0_4_ = tNothing;
    stack0xfffffffffffffb80 = (undefined1  [16])0x0;
    auStack_470 = (undefined1  [16])0x0;
    auStack_460._0_16_ = (undefined1  [16])0x0;
  }
  else {
    QVar44.m_data = (storage_type *)0x1c;
    QVar44.m_size = (qsizetype)local_488;
    QString::fromUtf8(QVar44);
    pQVar18 = (QArrayData *)CONCAT44(local_488._4_4_,local_488._0_4_);
    auStack_470._0_8_ = local_478;
    local_488._0_4_ = tTagValue;
    local_478 = (Data *)local_488._8_8_;
    local_488._8_8_ = pQVar18;
    if (pQVar18 != (QArrayData *)0x0) {
      LOCK();
      (pQVar18->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar18->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    auStack_470._8_8_ = pQVar17;
    if (pQVar17 != (QArrayData *)0x0) {
      LOCK();
      (pQVar17->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar17->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (pQVar18 != (QArrayData *)0x0) {
      LOCK();
      (pQVar18->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar18->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar18->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar18,2,0x10);
      }
    }
  }
  pXVar5 = XmlOutput::operator<<(pXVar5,(xml_output *)local_488);
  attrTagT(&local_4c0,"EnableFiberSafeOptimizations",*(triState *)((long)__buf + 0xd4));
  pXVar5 = XmlOutput::operator<<(pXVar5,&local_4c0);
  attrTagT(&local_4f8,"EnablePREfast",*(triState *)((long)__buf + 0x29c));
  pXVar5 = XmlOutput::operator<<(pXVar5,&local_4f8);
  if (*(long *)((long)__buf + 0x2f0) == 0) {
    local_530._0_4_ = tNothing;
    stack0xfffffffffffffad8 = (undefined1  [16])0x0;
    local_518 = (undefined1  [16])0x0;
    local_508 = (undefined1  [16])0x0;
  }
  else {
    QVar45.m_data = (storage_type *)0xe;
    QVar45.m_size = (qsizetype)local_530;
    QString::fromUtf8(QVar45);
    pQVar18 = (QArrayData *)CONCAT44(local_530._4_4_,local_530._0_4_);
    local_518._0_8_ = pDStack_520;
    local_530._0_4_ = tTagValue;
    pDStack_520 = (Data *)local_530._8_8_;
    local_530._8_8_ = pQVar18;
    if (pQVar18 != (QArrayData *)0x0) {
      LOCK();
      (pQVar18->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar18->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_518._8_8_ = *(undefined8 *)((long)__buf + 0x2e0);
    local_508 = *(undefined1 (*) [16])((long)__buf + 0x2e8);
    if ((int *)local_518._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_518._8_8_ = *(int *)local_518._8_8_ + 1;
      UNLOCK();
    }
    if (pQVar18 != (QArrayData *)0x0) {
      LOCK();
      (pQVar18->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar18->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar18->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar18,2,0x10);
      }
    }
  }
  pXVar5 = XmlOutput::operator<<(pXVar5,(xml_output *)local_530);
  iVar1 = *(int *)((long)__buf + 0xe0);
  if (iVar1 == 2) {
LAB_001f3ce6:
    psVar8 = (storage_type *)0x5;
LAB_001f3cf3:
    QVar46.m_data = psVar8;
    QVar46.m_size = (qsizetype)local_568;
    QString::fromUtf8(QVar46);
    pQVar18 = (QArrayData *)CONCAT44(local_568._4_4_,local_568._0_4_);
    auStack_540._8_8_ = local_558;
    auStack_540._0_8_ = local_568._8_8_;
  }
  else {
    if (iVar1 == 1) {
      psVar8 = (storage_type *)0x4;
      goto LAB_001f3cf3;
    }
    if (iVar1 == 0) goto LAB_001f3ce6;
    pQVar18 = (QArrayData *)0x0;
    auStack_540._0_8_ = (Data *)0x0;
    auStack_540._8_8_ = (char16_t *)0x0;
  }
  if ((char16_t *)auStack_540._8_8_ == (char16_t *)0x0) {
    local_568._0_4_ = tNothing;
    stack0xfffffffffffffaa0 = (undefined1  [16])0x0;
    auStack_550 = (undefined1  [16])0x0;
    auStack_540 = (undefined1  [16])0x0;
  }
  else {
    QVar47.m_data = (storage_type *)0x11;
    QVar47.m_size = (qsizetype)local_568;
    QString::fromUtf8(QVar47);
    pQVar19 = (QArrayData *)CONCAT44(local_568._4_4_,local_568._0_4_);
    auStack_550._0_8_ = local_558;
    local_568._0_4_ = tTagValue;
    local_558 = (Data *)local_568._8_8_;
    local_568._8_8_ = pQVar19;
    if (pQVar19 != (QArrayData *)0x0) {
      LOCK();
      (pQVar19->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar19->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    auStack_550._8_8_ = pQVar18;
    if (pQVar18 != (QArrayData *)0x0) {
      LOCK();
      (pQVar18->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar18->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (pQVar19 != (QArrayData *)0x0) {
      LOCK();
      (pQVar19->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar19->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar19->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar19,2,0x10);
      }
    }
  }
  pXVar5 = XmlOutput::operator<<(pXVar5,(xml_output *)local_568);
  attrTagT(&local_5a0,"ExpandAttributedSource",*(triState *)((long)__buf + 0xe4));
  pXVar5 = XmlOutput::operator<<(pXVar5,&local_5a0);
  if (*(int *)((long)__buf + 0xe8) == 1) {
    psVar8 = (storage_type *)0x5;
LAB_001f3e4b:
    QVar48.m_data = psVar8;
    QVar48.m_size = (qsizetype)local_5d8;
    QString::fromUtf8(QVar48);
    pQVar19 = (QArrayData *)CONCAT44(local_5d8._4_4_,local_5d8._0_4_);
    auStack_5b0._8_8_ = local_5c8;
    auStack_5b0._0_8_ = local_5d8._8_8_;
  }
  else {
    if (*(int *)((long)__buf + 0xe8) == 2) {
      psVar8 = (storage_type *)0x4;
      goto LAB_001f3e4b;
    }
    pQVar19 = (QArrayData *)0x0;
    auStack_5b0._0_8_ = (Data *)0x0;
    auStack_5b0._8_8_ = (char16_t *)0x0;
  }
  if ((char16_t *)auStack_5b0._8_8_ == (char16_t *)0x0) {
    local_5d8._0_4_ = tNothing;
    stack0xfffffffffffffa30 = (undefined1  [16])0x0;
    auStack_5c0 = (undefined1  [16])0x0;
    auStack_5b0 = (undefined1  [16])0x0;
  }
  else {
    QVar49.m_data = (storage_type *)0x10;
    QVar49.m_size = (qsizetype)local_5d8;
    QString::fromUtf8(QVar49);
    pQVar20 = (QArrayData *)CONCAT44(local_5d8._4_4_,local_5d8._0_4_);
    auStack_5c0._0_8_ = local_5c8;
    local_5d8._0_4_ = tTagValue;
    local_5c8 = (Data *)local_5d8._8_8_;
    local_5d8._8_8_ = pQVar20;
    if (pQVar20 != (QArrayData *)0x0) {
      LOCK();
      (pQVar20->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar20->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    auStack_5c0._8_8_ = pQVar19;
    if (pQVar19 != (QArrayData *)0x0) {
      LOCK();
      (pQVar19->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar19->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (pQVar20 != (QArrayData *)0x0) {
      LOCK();
      (pQVar20->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar20->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar20->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar20,2,0x10);
      }
    }
  }
  pXVar5 = XmlOutput::operator<<(pXVar5,(xml_output *)local_5d8);
  attrTagT(&local_610,"FloatingPointExceptions",*(triState *)((long)__buf + 0xf0));
  pXVar5 = XmlOutput::operator<<(pXVar5,&local_610);
  iVar1 = *(int *)((long)__buf + 0xec);
  if (iVar1 == 0) {
    psVar8 = (storage_type *)0x7;
LAB_001f3fbd:
    QVar50.m_data = psVar8;
    QVar50.m_size = (qsizetype)local_648;
    QString::fromUtf8(QVar50);
    pQVar20 = (QArrayData *)CONCAT44(local_648._4_4_,local_648._0_4_);
    auStack_620._8_8_ = local_638;
    auStack_620._0_8_ = local_648._8_8_;
  }
  else {
    if (iVar1 == 1) {
      psVar8 = (storage_type *)0x6;
      goto LAB_001f3fbd;
    }
    if (iVar1 == 2) {
      psVar8 = (storage_type *)0x4;
      goto LAB_001f3fbd;
    }
    pQVar20 = (QArrayData *)0x0;
    auStack_620._0_8_ = (Data *)0x0;
    auStack_620._8_8_ = (char16_t *)0x0;
  }
  if ((char16_t *)auStack_620._8_8_ == (char16_t *)0x0) {
    local_648._0_4_ = tNothing;
    stack0xfffffffffffff9c0 = (undefined1  [16])0x0;
    auStack_630 = (undefined1  [16])0x0;
    auStack_620 = (undefined1  [16])0x0;
  }
  else {
    QVar51.m_data = (storage_type *)0x12;
    QVar51.m_size = (qsizetype)local_648;
    QString::fromUtf8(QVar51);
    pQVar21 = (QArrayData *)CONCAT44(local_648._4_4_,local_648._0_4_);
    auStack_630._0_8_ = local_638;
    local_648._0_4_ = tTagValue;
    local_638 = (Data *)local_648._8_8_;
    local_648._8_8_ = pQVar21;
    if (pQVar21 != (QArrayData *)0x0) {
      LOCK();
      (pQVar21->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar21->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    auStack_630._8_8_ = pQVar20;
    if (pQVar20 != (QArrayData *)0x0) {
      LOCK();
      (pQVar20->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar20->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (pQVar21 != (QArrayData *)0x0) {
      LOCK();
      (pQVar21->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar21->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar21->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar21,2,0x10);
      }
    }
  }
  pXVar5 = XmlOutput::operator<<(pXVar5,(xml_output *)local_648);
  attrTagT(&local_680,"ForceConformanceInForLoopScope",*(triState *)((long)__buf + 0xf4));
  pXVar5 = XmlOutput::operator<<(pXVar5,&local_680);
  attrTagX(&local_6b8,"ForcedIncludeFiles",(QStringList *)((long)__buf + 0xf8),";");
  pXVar5 = XmlOutput::operator<<(pXVar5,&local_6b8);
  attrTagX(&local_6f0,"ForcedUsingFiles",(QStringList *)((long)__buf + 0x110),";");
  pXVar5 = XmlOutput::operator<<(pXVar5,&local_6f0);
  attrTagT(&local_728,"FunctionLevelLinking",*(triState *)((long)__buf + 0xd8));
  pXVar5 = XmlOutput::operator<<(pXVar5,&local_728);
  attrTagT(&local_760,"GenerateXMLDocumentationFiles",*(triState *)((long)__buf + 0x2c0));
  pXVar5 = XmlOutput::operator<<(pXVar5,&local_760);
  attrTagT(&local_798,"IgnoreStandardIncludePath",*(triState *)((long)__buf + 0x134));
  pXVar5 = XmlOutput::operator<<(pXVar5,&local_798);
  iVar1 = *(int *)((long)__buf + 0x13c);
  if (iVar1 == 2) {
    psVar8 = (storage_type *)0xb;
LAB_001f4220:
    QVar52.m_data = psVar8;
    QVar52.m_size = (qsizetype)local_7d8;
    QString::fromUtf8(QVar52);
    pQVar21 = (QArrayData *)CONCAT44(local_7d8._4_4_,local_7d8._0_4_);
    auStack_7b0._8_8_ = local_7c8;
    auStack_7b0._0_8_ = local_7d8._8_8_;
  }
  else {
    if (iVar1 == 1) {
      psVar8 = (storage_type *)0x12;
      goto LAB_001f4220;
    }
    if (iVar1 == 0) {
      psVar8 = &DAT_00000008;
      goto LAB_001f4220;
    }
    pQVar21 = (QArrayData *)0x0;
    auStack_7b0._0_8_ = (Data *)0x0;
    auStack_7b0._8_8_ = (char16_t *)0x0;
  }
  if ((char16_t *)auStack_7b0._8_8_ == (char16_t *)0x0) {
    local_7d8._0_4_ = tNothing;
    stack0xfffffffffffff830 = (undefined1  [16])0x0;
    auStack_7c0 = (undefined1  [16])0x0;
    auStack_7b0._0_16_ = (undefined1  [16])0x0;
  }
  else {
    QVar53.m_data = (storage_type *)0x17;
    QVar53.m_size = (qsizetype)local_7d8;
    QString::fromUtf8(QVar53);
    pQVar22 = (QArrayData *)CONCAT44(local_7d8._4_4_,local_7d8._0_4_);
    auStack_7c0._0_8_ = local_7c8;
    local_7d8._0_4_ = tTagValue;
    local_7c8 = (Data *)local_7d8._8_8_;
    local_7d8._8_8_ = pQVar22;
    if (pQVar22 != (QArrayData *)0x0) {
      LOCK();
      (pQVar22->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar22->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    auStack_7c0._8_8_ = pQVar21;
    if (pQVar21 != (QArrayData *)0x0) {
      LOCK();
      (pQVar21->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar21->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (pQVar22 != (QArrayData *)0x0) {
      LOCK();
      (pQVar22->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar22->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar22->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar22,2,0x10);
      }
    }
  }
  pXVar5 = XmlOutput::operator<<(pXVar5,(xml_output *)local_7d8);
  attrTagT(&local_810,"IntrinsicFunctions",*(triState *)((long)__buf + 0xdc));
  pXVar5 = XmlOutput::operator<<(pXVar5,&local_810);
  attrTagT(&local_848,"MinimalRebuild",*(triState *)((long)__buf + 0x178));
  pXVar5 = XmlOutput::operator<<(pXVar5,&local_848);
  attrTagT(&local_880,"MultiProcessorCompilation",*(triState *)((long)__buf + 0x2a4));
  pXVar5 = XmlOutput::operator<<(pXVar5,&local_880);
  if (*(long *)((long)__buf + 0x158) == 0) {
    local_8b8._0_4_ = tNothing;
    stack0xfffffffffffff750 = (undefined1  [16])0x0;
    local_8a0 = (undefined1  [16])0x0;
    local_890 = (undefined1  [16])0x0;
  }
  else {
    QVar54.m_data = (storage_type *)0x10;
    QVar54.m_size = (qsizetype)local_8b8;
    QString::fromUtf8(QVar54);
    pQVar22 = (QArrayData *)CONCAT44(local_8b8._4_4_,local_8b8._0_4_);
    local_8a0._0_8_ = pDStack_8a8;
    local_8b8._0_4_ = tTagValue;
    pDStack_8a8 = (Data *)local_8b8._8_8_;
    local_8b8._8_8_ = pQVar22;
    if (pQVar22 != (QArrayData *)0x0) {
      LOCK();
      (pQVar22->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar22->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_8a0._8_8_ = *(undefined8 *)((long)__buf + 0x148);
    local_890 = *(undefined1 (*) [16])((long)__buf + 0x150);
    if ((int *)local_8a0._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_8a0._8_8_ = *(int *)local_8a0._8_8_ + 1;
      UNLOCK();
    }
    if (pQVar22 != (QArrayData *)0x0) {
      LOCK();
      (pQVar22->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar22->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar22->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar22,2,0x10);
      }
    }
  }
  pXVar5 = XmlOutput::operator<<(pXVar5,(xml_output *)local_8b8);
  if (*(long *)((long)__buf + 0x170) == 0) {
    local_8f0._0_4_ = tNothing;
    stack0xfffffffffffff718 = (undefined1  [16])0x0;
    local_8d8 = (undefined1  [16])0x0;
    local_8c8 = (undefined1  [16])0x0;
  }
  else {
    QVar55.m_data = (storage_type *)0x12;
    QVar55.m_size = (qsizetype)local_8f0;
    QString::fromUtf8(QVar55);
    pQVar22 = (QArrayData *)CONCAT44(local_8f0._4_4_,local_8f0._0_4_);
    local_8d8._0_8_ = pDStack_8e0;
    local_8f0._0_4_ = tTagValue;
    pDStack_8e0 = (Data *)local_8f0._8_8_;
    local_8f0._8_8_ = pQVar22;
    if (pQVar22 != (QArrayData *)0x0) {
      LOCK();
      (pQVar22->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar22->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_8d8._8_8_ = *(undefined8 *)((long)__buf + 0x160);
    local_8c8 = *(undefined1 (*) [16])((long)__buf + 0x168);
    if ((int *)local_8d8._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_8d8._8_8_ = *(int *)local_8d8._8_8_ + 1;
      UNLOCK();
    }
    if (pQVar22 != (QArrayData *)0x0) {
      LOCK();
      (pQVar22->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar22->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar22->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar22,2,0x10);
      }
    }
  }
  pXVar5 = XmlOutput::operator<<(pXVar5,(xml_output *)local_8f0);
  if (*(long *)((long)__buf + 400) == 0) {
    local_928._0_4_ = tNothing;
    stack0xfffffffffffff6e0 = (undefined1  [16])0x0;
    local_910 = (undefined1  [16])0x0;
    local_900 = (undefined1  [16])0x0;
  }
  else {
    QVar56.m_data = (storage_type *)0xe;
    QVar56.m_size = (qsizetype)local_928;
    QString::fromUtf8(QVar56);
    pQVar22 = (QArrayData *)CONCAT44(local_928._4_4_,local_928._0_4_);
    local_910._0_8_ = pDStack_918;
    local_928._0_4_ = tTagValue;
    pDStack_918 = (Data *)local_928._8_8_;
    local_928._8_8_ = pQVar22;
    if (pQVar22 != (QArrayData *)0x0) {
      LOCK();
      (pQVar22->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar22->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_910._8_8_ = *(undefined8 *)((long)__buf + 0x180);
    local_900 = *(undefined1 (*) [16])((long)__buf + 0x188);
    if ((int *)local_910._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_910._8_8_ = *(int *)local_910._8_8_ + 1;
      UNLOCK();
    }
    if (pQVar22 != (QArrayData *)0x0) {
      LOCK();
      (pQVar22->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar22->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar22->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar22,2,0x10);
      }
    }
  }
  pXVar5 = XmlOutput::operator<<(pXVar5,(xml_output *)local_928);
  attrTagT(&local_960,"OmitDefaultLibName",*(triState *)((long)__buf + 0x198));
  pXVar5 = XmlOutput::operator<<(pXVar5,&local_960);
  attrTagT(&local_998,"OmitFramePointers",*(triState *)((long)__buf + 0x19c));
  pXVar5 = XmlOutput::operator<<(pXVar5,&local_998);
  attrTagT(&local_9d0,"OpenMPSupport",*(triState *)((long)__buf + 0x1a0));
  pXVar5 = XmlOutput::operator<<(pXVar5,&local_9d0);
  switch(*(undefined4 *)((long)__buf + 0x1a4)) {
  case 0:
    break;
  case 1:
    break;
  case 2:
    break;
  case 3:
    psVar8 = (storage_type *)0x4;
    goto LAB_001f46fe;
  default:
    pQVar22 = (QArrayData *)0x0;
    auStack_9e0._8_8_ = (char16_t *)0x0;
    auStack_9e0._0_8_ = (Data *)0x0;
    goto LAB_001f470f;
  }
  psVar8 = &DAT_00000008;
LAB_001f46fe:
  QVar57.m_data = psVar8;
  QVar57.m_size = (qsizetype)local_a08;
  QString::fromUtf8(QVar57);
  pQVar22 = (QArrayData *)CONCAT44(local_a08._4_4_,local_a08._0_4_);
  auStack_9e0._8_8_ = local_9f8;
  auStack_9e0._0_8_ = local_a08._8_8_;
LAB_001f470f:
  if ((char16_t *)auStack_9e0._8_8_ == (char16_t *)0x0) {
    local_a08._0_4_ = tNothing;
    stack0xfffffffffffff600 = (undefined1  [16])0x0;
    auStack_9f0 = (undefined1  [16])0x0;
    auStack_9e0 = (undefined1  [16])0x0;
  }
  else {
    QVar58.m_data = &DAT_0000000c;
    QVar58.m_size = (qsizetype)local_a08;
    QString::fromUtf8(QVar58);
    pQVar23 = (QArrayData *)CONCAT44(local_a08._4_4_,local_a08._0_4_);
    auStack_9f0._0_8_ = local_9f8;
    local_a08._0_4_ = tTagValue;
    local_9f8 = (Data *)local_a08._8_8_;
    local_a08._8_8_ = pQVar23;
    if (pQVar23 != (QArrayData *)0x0) {
      LOCK();
      (pQVar23->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar23->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    auStack_9f0._8_8_ = pQVar22;
    if (pQVar22 != (QArrayData *)0x0) {
      LOCK();
      (pQVar22->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar22->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (pQVar23 != (QArrayData *)0x0) {
      LOCK();
      (pQVar23->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar23->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar23->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar23,2,0x10);
      }
    }
  }
  pXVar5 = XmlOutput::operator<<(pXVar5,(xml_output *)local_a08);
  iVar1 = *(int *)((long)__buf + 0x268);
  if (iVar1 == 3) {
    psVar8 = (storage_type *)0x3;
LAB_001f483b:
    QVar59.m_data = psVar8;
    QVar59.m_size = (qsizetype)local_a48;
    QString::fromUtf8(QVar59);
    pQVar23 = (QArrayData *)CONCAT44(local_a48._4_4_,local_a48._0_4_);
    auStack_a20._8_8_ = local_a38;
    auStack_a20._0_8_ = local_a48._8_8_;
  }
  else {
    if (iVar1 == 1) {
      psVar8 = (storage_type *)0x6;
      goto LAB_001f483b;
    }
    if (iVar1 == 0) {
      psVar8 = &DAT_00000008;
      goto LAB_001f483b;
    }
    pQVar23 = (QArrayData *)0x0;
    auStack_a20._0_8_ = (Data *)0x0;
    auStack_a20._8_8_ = (char16_t *)0x0;
  }
  if ((char16_t *)auStack_a20._8_8_ == (char16_t *)0x0) {
    local_a48._0_4_ = tNothing;
    stack0xfffffffffffff5c0 = (undefined1  [16])0x0;
    auStack_a30 = (undefined1  [16])0x0;
    auStack_a20._0_16_ = (undefined1  [16])0x0;
  }
  else {
    QVar60.m_data = (storage_type *)0x11;
    QVar60.m_size = (qsizetype)local_a48;
    QString::fromUtf8(QVar60);
    pQVar24 = (QArrayData *)CONCAT44(local_a48._4_4_,local_a48._0_4_);
    auStack_a30._0_8_ = local_a38;
    local_a48._0_4_ = tTagValue;
    local_a38 = (Data *)local_a48._8_8_;
    local_a48._8_8_ = pQVar24;
    if (pQVar24 != (QArrayData *)0x0) {
      LOCK();
      (pQVar24->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar24->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    auStack_a30._8_8_ = pQVar23;
    if (pQVar23 != (QArrayData *)0x0) {
      LOCK();
      (pQVar23->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar23->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (pQVar24 != (QArrayData *)0x0) {
      LOCK();
      (pQVar24->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar24->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar24->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar24,2,0x10);
      }
    }
  }
  pXVar5 = XmlOutput::operator<<(pXVar5,(xml_output *)local_a48);
  if (*(long *)((long)__buf + 0x1f0) == 0) {
    local_a80._0_4_ = tNothing;
    stack0xfffffffffffff588 = (undefined1  [16])0x0;
    local_a68 = (undefined1  [16])0x0;
    local_a58 = (undefined1  [16])0x0;
  }
  else {
    QVar61.m_data = (storage_type *)0x15;
    QVar61.m_size = (qsizetype)local_a80;
    QString::fromUtf8(QVar61);
    pQVar24 = (QArrayData *)CONCAT44(local_a80._4_4_,local_a80._0_4_);
    local_a68._0_8_ = pDStack_a70;
    local_a80._0_4_ = tTagValue;
    pDStack_a70 = (Data *)local_a80._8_8_;
    local_a80._8_8_ = pQVar24;
    if (pQVar24 != (QArrayData *)0x0) {
      LOCK();
      (pQVar24->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar24->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_a68._8_8_ = *(undefined8 *)((long)__buf + 0x1e0);
    local_a58 = *(undefined1 (*) [16])((long)__buf + 0x1e8);
    if ((int *)local_a68._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_a68._8_8_ = *(int *)local_a68._8_8_ + 1;
      UNLOCK();
    }
    if (pQVar24 != (QArrayData *)0x0) {
      LOCK();
      (pQVar24->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar24->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar24->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar24,2,0x10);
      }
    }
  }
  pXVar5 = XmlOutput::operator<<(pXVar5,(xml_output *)local_a80);
  if (*(long *)((long)__buf + 0x1d8) == 0) {
    local_ab8._0_4_ = tNothing;
    stack0xfffffffffffff550 = (undefined1  [16])0x0;
    local_aa0 = (undefined1  [16])0x0;
    local_a90 = (undefined1  [16])0x0;
  }
  else {
    QVar62.m_data = (storage_type *)0x1b;
    QVar62.m_size = (qsizetype)local_ab8;
    QString::fromUtf8(QVar62);
    pQVar24 = (QArrayData *)CONCAT44(local_ab8._4_4_,local_ab8._0_4_);
    local_aa0._0_8_ = pDStack_aa8;
    local_ab8._0_4_ = tTagValue;
    pDStack_aa8 = (Data *)local_ab8._8_8_;
    local_ab8._8_8_ = pQVar24;
    if (pQVar24 != (QArrayData *)0x0) {
      LOCK();
      (pQVar24->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar24->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_aa0._8_8_ = *(undefined8 *)((long)__buf + 0x1c8);
    local_a90 = *(undefined1 (*) [16])((long)__buf + 0x1d0);
    if ((int *)local_aa0._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_aa0._8_8_ = *(int *)local_aa0._8_8_ + 1;
      UNLOCK();
    }
    if (pQVar24 != (QArrayData *)0x0) {
      LOCK();
      (pQVar24->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar24->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar24->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar24,2,0x10);
      }
    }
  }
  pXVar5 = XmlOutput::operator<<(pXVar5,(xml_output *)local_ab8);
  attrTagT(&local_af0,"PreprocessKeepComments",*(triState *)((long)__buf + 0x140));
  pXVar5 = XmlOutput::operator<<(pXVar5,&local_af0);
  local_b48 = (undefined1  [16])0x0;
  local_b38 = 0;
  QList<QString>::reserve((QList<QString> *)local_b48,*(qsizetype *)((long)__buf + 0x208));
  if (*(long *)((long)__buf + 0x208) != 0) {
    lVar7 = 0x10;
    uVar10 = 0;
    do {
      lVar2 = *(long *)((long)__buf + 0x200);
      local_b28._0_8_ = *(long *)(lVar2 + -0x10 + lVar7);
      local_b28.xo_text.d.d = *(Data **)(lVar2 + -8 + lVar7);
      local_b28.xo_text.d.ptr = *(char16_t **)(lVar2 + lVar7);
      if ((QArrayData *)local_b28._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)local_b28._0_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)local_b28._0_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QVar63.m_data = (char *)0x2;
      QVar63.m_size = (qsizetype)&local_b28;
      QVar75.m_data = (char *)0x1;
      QVar75.m_size = (qsizetype)"\\\"";
      QString::replace(QVar63,QVar75,0x2b1745);
      QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                ((QMovableArrayOps<QString> *)local_b48,local_b38,(QString *)&local_b28);
      QList<QString>::end((QList<QString> *)local_b48);
      if ((QArrayData *)local_b28._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_b28._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_b28._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_b28._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_b28._0_8_,2,0x10);
        }
      }
      uVar10 = uVar10 + 1;
      lVar7 = lVar7 + 0x18;
    } while (uVar10 < *(ulong *)((long)__buf + 0x208));
  }
  attrTagX(&local_b28,"PreprocessorDefinitions",(QStringList *)local_b48,";");
  pXVar5 = XmlOutput::operator<<(pXVar5,&local_b28);
  if (*(long *)((long)__buf + 0x310) == 0) {
    local_b80._0_4_ = tNothing;
    stack0xfffffffffffff488 = (undefined1  [16])0x0;
    local_b68 = (undefined1  [16])0x0;
    local_b58 = (undefined1  [16])0x0;
  }
  else {
    QVar64.m_data = (storage_type *)0x14;
    QVar64.m_size = (qsizetype)local_b80;
    QString::fromUtf8(QVar64);
    pQVar24 = (QArrayData *)CONCAT44(local_b80._4_4_,local_b80._0_4_);
    local_b68._0_8_ = pDStack_b70;
    local_b80._0_4_ = tTagValue;
    pDStack_b70 = (Data *)local_b80._8_8_;
    local_b80._8_8_ = pQVar24;
    if (pQVar24 != (QArrayData *)0x0) {
      LOCK();
      (pQVar24->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar24->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_b68._8_8_ = *(undefined8 *)((long)__buf + 0x300);
    local_b58 = *(undefined1 (*) [16])((long)__buf + 0x308);
    if ((int *)local_b68._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_b68._8_8_ = *(int *)local_b68._8_8_ + 1;
      UNLOCK();
    }
    if (pQVar24 != (QArrayData *)0x0) {
      LOCK();
      (pQVar24->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar24->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar24->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar24,2,0x10);
      }
    }
  }
  pXVar5 = XmlOutput::operator<<(pXVar5,(xml_output *)local_b80);
  attrTagT(&local_bb8,"PreprocessSuppressLineNumbers",*(triState *)((long)__buf + 300));
  pXVar5 = XmlOutput::operator<<(pXVar5,&local_bb8);
  tVar6 = unset;
  if ((ulong)*(uint *)((long)__buf + 0x128) < 3) {
    tVar6 = *(triState *)(&DAT_002adc50 + (ulong)*(uint *)((long)__buf + 0x128) * 4);
  }
  attrTagT(&local_bf0,"PreprocessToFile",tVar6);
  pXVar5 = XmlOutput::operator<<(pXVar5,&local_bf0);
  if ((((*(int *)(*(long *)((long)__buf + 0x318) + 4) < 0xb0) || (*(int *)((long)__buf + 0xa8) != 0)
       ) || (*(long *)((long)__buf + 0x220) != 0)) && (*(long *)((long)__buf + 0x220) == 0)) {
    local_c28._0_4_ = tNothing;
    stack0xfffffffffffff3e0 = (undefined1  [16])0x0;
    local_c10 = (undefined1  [16])0x0;
    local_c00 = (undefined1  [16])0x0;
  }
  else {
    QVar65.m_data = (storage_type *)0x17;
    QVar65.m_size = (qsizetype)local_c28;
    QString::fromUtf8(QVar65);
    pQVar24 = (QArrayData *)CONCAT44(local_c28._4_4_,local_c28._0_4_);
    local_c10._0_8_ = pDStack_c18;
    local_c28._0_4_ = tTagValue;
    pDStack_c18 = (Data *)local_c28._8_8_;
    local_c28._8_8_ = pQVar24;
    if (pQVar24 != (QArrayData *)0x0) {
      LOCK();
      (pQVar24->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar24->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_c10._8_8_ = *(undefined8 *)((long)__buf + 0x210);
    local_c00 = *(undefined1 (*) [16])((long)__buf + 0x218);
    if ((int *)local_c10._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_c10._8_8_ = *(int *)local_c10._8_8_ + 1;
      UNLOCK();
    }
    if (pQVar24 != (QArrayData *)0x0) {
      LOCK();
      (pQVar24->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar24->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar24->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar24,2,0x10);
      }
    }
  }
  pXVar5 = XmlOutput::operator<<(pXVar5,(xml_output *)local_c28);
  if (*(long *)((long)__buf + 0x2b8) == 0) {
    local_c60._0_4_ = tNothing;
    stack0xfffffffffffff3a8 = (undefined1  [16])0x0;
    local_c48 = (undefined1  [16])0x0;
    local_c38 = (undefined1  [16])0x0;
  }
  else {
    QVar66.m_data = (storage_type *)0xf;
    QVar66.m_size = (qsizetype)local_c60;
    QString::fromUtf8(QVar66);
    pQVar24 = (QArrayData *)CONCAT44(local_c60._4_4_,local_c60._0_4_);
    local_c48._0_8_ = pDStack_c50;
    local_c60._0_4_ = tTagValue;
    pDStack_c50 = (Data *)local_c60._8_8_;
    local_c60._8_8_ = pQVar24;
    if (pQVar24 != (QArrayData *)0x0) {
      LOCK();
      (pQVar24->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar24->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_c48._8_8_ = *(undefined8 *)((long)__buf + 0x2a8);
    local_c38 = *(undefined1 (*) [16])((long)__buf + 0x2b0);
    if ((int *)local_c48._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_c48._8_8_ = *(int *)local_c48._8_8_ + 1;
      UNLOCK();
    }
    if (pQVar24 != (QArrayData *)0x0) {
      LOCK();
      (pQVar24->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar24->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar24->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar24,2,0x10);
      }
    }
  }
  pXVar5 = XmlOutput::operator<<(pXVar5,(xml_output *)local_c60);
  switch(*(undefined4 *)((long)__buf + 0x228)) {
  case 0:
    psVar8 = (storage_type *)0xd;
    break;
  case 1:
    psVar8 = (storage_type *)0x12;
    break;
  case 2:
    psVar8 = (storage_type *)0x10;
    break;
  case 3:
    psVar8 = (storage_type *)0x15;
    break;
  default:
    pQVar24 = (QArrayData *)0x0;
    auStack_c70._8_8_ = (char16_t *)0x0;
    auStack_c70._0_8_ = (Data *)0x0;
    goto LAB_001f5027;
  }
  QVar67.m_data = psVar8;
  QVar67.m_size = (qsizetype)local_c98;
  QString::fromUtf8(QVar67);
  pQVar24 = (QArrayData *)CONCAT44(local_c98._4_4_,local_c98._0_4_);
  auStack_c70._8_8_ = local_c88;
  auStack_c70._0_8_ = local_c98._8_8_;
LAB_001f5027:
  if ((char16_t *)auStack_c70._8_8_ == (char16_t *)0x0) {
    local_c98._0_4_ = tNothing;
    stack0xfffffffffffff370 = (undefined1  [16])0x0;
    auStack_c80 = (undefined1  [16])0x0;
    auStack_c70 = (undefined1  [16])0x0;
  }
  else {
    QVar68.m_data = (storage_type *)0xe;
    QVar68.m_size = (qsizetype)local_c98;
    QString::fromUtf8(QVar68);
    pQVar25 = (QArrayData *)CONCAT44(local_c98._4_4_,local_c98._0_4_);
    auStack_c80._0_8_ = local_c88;
    local_c98._0_4_ = tTagValue;
    local_c88 = (Data *)local_c98._8_8_;
    local_c98._8_8_ = pQVar25;
    if (pQVar25 != (QArrayData *)0x0) {
      LOCK();
      (pQVar25->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar25->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    auStack_c80._8_8_ = pQVar24;
    if (pQVar24 != (QArrayData *)0x0) {
      LOCK();
      (pQVar24->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar24->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (pQVar25 != (QArrayData *)0x0) {
      LOCK();
      (pQVar25->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar25->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar25->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar25,2,0x10);
      }
    }
  }
  pXVar5 = XmlOutput::operator<<(pXVar5,(xml_output *)local_c98);
  attrTagT(&local_cd0,"RuntimeTypeInfo",*(triState *)((long)__buf + 0x22c));
  pXVar5 = XmlOutput::operator<<(pXVar5,&local_cd0);
  attrTagT(&local_d08,"ShowIncludes",*(triState *)((long)__buf + 0x230));
  pXVar5 = XmlOutput::operator<<(pXVar5,&local_d08);
  attrTagT(&local_d40,"SmallerTypeCheck",*(triState *)((long)__buf + 0x234));
  pXVar5 = XmlOutput::operator<<(pXVar5,&local_d40);
  attrTagT(&local_d78,"StringPooling",*(triState *)((long)__buf + 0x238));
  pXVar5 = XmlOutput::operator<<(pXVar5,&local_d78);
  switch(*(undefined4 *)((long)__buf + 0x23c)) {
  case 1:
    psVar8 = (storage_type *)0x5;
    goto LAB_001f524f;
  case 2:
    break;
  case 3:
    break;
  case 4:
    break;
  case 5:
    psVar8 = (storage_type *)0x7;
    goto LAB_001f524f;
  default:
    pQVar25 = (QArrayData *)0x0;
    auStack_d90._8_8_ = (char16_t *)0x0;
    auStack_d90._0_8_ = (Data *)0x0;
    goto LAB_001f525f;
  }
  psVar8 = (storage_type *)0x6;
LAB_001f524f:
  QVar69.m_data = psVar8;
  QVar69.m_size = (qsizetype)local_db8;
  QString::fromUtf8(QVar69);
  pQVar25 = (QArrayData *)CONCAT44(local_db8._4_4_,local_db8._0_4_);
  auStack_d90._8_8_ = local_da8;
  auStack_d90._0_8_ = local_db8._8_8_;
LAB_001f525f:
  if ((char16_t *)auStack_d90._8_8_ == (char16_t *)0x0) {
    local_db8._0_4_ = tNothing;
    stack0xfffffffffffff250 = (undefined1  [16])0x0;
    auStack_da0 = (undefined1  [16])0x0;
    auStack_d90._0_16_ = (undefined1  [16])0x0;
  }
  else {
    QVar70.m_data = (storage_type *)0x15;
    QVar70.m_size = (qsizetype)local_db8;
    QString::fromUtf8(QVar70);
    pQVar26 = (QArrayData *)CONCAT44(local_db8._4_4_,local_db8._0_4_);
    auStack_da0._0_8_ = local_da8;
    local_db8._0_4_ = tTagValue;
    local_da8 = (Data *)local_db8._8_8_;
    local_db8._8_8_ = pQVar26;
    if (pQVar26 != (QArrayData *)0x0) {
      LOCK();
      (pQVar26->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar26->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    auStack_da0._8_8_ = pQVar25;
    if (pQVar25 != (QArrayData *)0x0) {
      LOCK();
      (pQVar25->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar25->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (pQVar26 != (QArrayData *)0x0) {
      LOCK();
      (pQVar26->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar26->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar26->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar26,2,0x10);
      }
    }
  }
  pXVar5 = XmlOutput::operator<<(pXVar5,(xml_output *)local_db8);
  attrTagT(&local_df0,"SuppressStartupBanner",*(triState *)((long)__buf + 0x240));
  pXVar5 = XmlOutput::operator<<(pXVar5,&local_df0);
  attrTagX(&local_e28,"TreatSpecificWarningsAsErrors",(QStringList *)((long)__buf + 0x270),";");
  pXVar5 = XmlOutput::operator<<(pXVar5,&local_e28);
  attrTagT(&local_e60,"TreatWarningAsError",*(triState *)((long)__buf + 0x288));
  pXVar5 = XmlOutput::operator<<(pXVar5,&local_e60);
  attrTagT(&local_e98,"TreatWChar_tAsBuiltInType",*(triState *)((long)__buf + 0x244));
  pXVar5 = XmlOutput::operator<<(pXVar5,&local_e98);
  attrTagT(&local_ed0,"UndefineAllPreprocessorDefinitions",*(triState *)((long)__buf + 0x24c));
  pXVar5 = XmlOutput::operator<<(pXVar5,&local_ed0);
  attrTagX(&local_f08,"UndefinePreprocessorDefinitions",(QStringList *)((long)__buf + 0x250),";");
  pXVar5 = XmlOutput::operator<<(pXVar5,&local_f08);
  attrTagT(&local_f40,"UseFullPaths",*(triState *)((long)__buf + 0x2a0));
  pXVar5 = XmlOutput::operator<<(pXVar5,&local_f40);
  attrTagT(&local_f78,"UseUnicodeForAssemblerListing",*(triState *)((long)__buf + 0x26c));
  pXVar5 = XmlOutput::operator<<(pXVar5,&local_f78);
  switch(*(undefined4 *)((long)__buf + 0x28c)) {
  case 0:
    psVar8 = (storage_type *)0x12;
    goto LAB_001f54fe;
  case 1:
    break;
  case 2:
    break;
  case 3:
    break;
  case 4:
    break;
  default:
    pQVar26 = (QArrayData *)0x0;
    auStack_f90._8_8_ = (char16_t *)0x0;
    auStack_f90._0_8_ = (Data *)0x0;
    goto LAB_001f550f;
  }
  psVar8 = (storage_type *)0x6;
LAB_001f54fe:
  QVar71.m_data = psVar8;
  QVar71.m_size = (qsizetype)local_fb8;
  QString::fromUtf8(QVar71);
  pQVar26 = (QArrayData *)CONCAT44(local_fb8._4_4_,local_fb8._0_4_);
  auStack_f90._8_8_ = local_fa8;
  auStack_f90._0_8_ = local_fb8._8_8_;
LAB_001f550f:
  if ((char16_t *)auStack_f90._8_8_ == (char16_t *)0x0) {
    local_fb8._0_4_ = tNothing;
    stack0xfffffffffffff050 = (undefined1  [16])0x0;
    auStack_fa0 = (undefined1  [16])0x0;
    auStack_f90._0_16_ = (undefined1  [16])0x0;
  }
  else {
    QVar72.m_data = &DAT_0000000c;
    QVar72.m_size = (qsizetype)local_fb8;
    QString::fromUtf8(QVar72);
    pQVar3 = (QArrayData *)CONCAT44(local_fb8._4_4_,local_fb8._0_4_);
    auStack_fa0._0_8_ = local_fa8;
    local_fb8._0_4_ = tTagValue;
    local_fa8 = (Data *)local_fb8._8_8_;
    local_fb8._8_8_ = pQVar3;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    auStack_fa0._8_8_ = pQVar26;
    if (pQVar26 != (QArrayData *)0x0) {
      LOCK();
      (pQVar26->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar26->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
  }
  pXVar5 = XmlOutput::operator<<(pXVar5,(xml_output *)local_fb8);
  attrTagT(&local_ff0,"WholeProgramOptimization",*(triState *)((long)__buf + 0x290));
  pXVar5 = XmlOutput::operator<<(pXVar5,&local_ff0);
  if (*(long *)((long)__buf + 0x2d8) == 0) {
    local_1028._0_4_ = tNothing;
    stack0xffffffffffffefe0 = (undefined1  [16])0x0;
    local_1010 = (undefined1  [16])0x0;
    local_1000 = (undefined1  [16])0x0;
  }
  else {
    QVar73.m_data = (storage_type *)0x18;
    QVar73.m_size = (qsizetype)local_1028;
    QString::fromUtf8(QVar73);
    pQVar3 = (QArrayData *)CONCAT44(local_1028._4_4_,local_1028._0_4_);
    local_1010._0_8_ = pDStack_1018;
    local_1028._0_4_ = tTagValue;
    pDStack_1018 = (Data *)local_1028._8_8_;
    local_1028._8_8_ = pQVar3;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_1010._8_8_ = *(undefined8 *)((long)__buf + 0x2c8);
    local_1000 = *(undefined1 (*) [16])((long)__buf + 0x2d0);
    if ((int *)local_1010._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_1010._8_8_ = *(int *)local_1010._8_8_ + 1;
      UNLOCK();
    }
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
  }
  pXVar5 = XmlOutput::operator<<(pXVar5,(xml_output *)local_1028);
  QVar74.m_data = (storage_type *)0x9;
  QVar74.m_size = (qsizetype)&local_1060;
  QString::fromUtf8(QVar74);
  local_1060.xo_text.d.size = (qsizetype)local_1060.xo_text.d.ptr;
  pQVar3 = (QArrayData *)CONCAT44(local_1060._4_4_,local_1060.xo_type);
  local_1060.xo_type = tCloseTag;
  local_1060.xo_text.d.ptr = (char16_t *)local_1060.xo_text.d.d;
  if (pQVar3 != (QArrayData *)0x0) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_1060.xo_value.d.d = (Data *)0x0;
  local_1060.xo_value.d.ptr = (char16_t *)0x0;
  local_1060.xo_value.d.size = 0;
  local_1060.xo_text.d.d = (Data *)pQVar3;
  XmlOutput::operator<<(pXVar5,&local_1060);
  if (&(local_1060.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_1060.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_1060.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_1060.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_1060.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_1060.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_1060.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_1060.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_1060.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_1060.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (pQVar3 != (QArrayData *)0x0) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar3,2,0x10);
    }
  }
  if ((QArrayData *)local_1010._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_1010._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_1010._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_1010._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_1010._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_1028._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_1028._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_1028._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_1028._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_1028._8_8_,2,0x10);
    }
  }
  if (&(local_ff0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_ff0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_ff0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_ff0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_ff0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_ff0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_ff0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_ff0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_ff0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_ff0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QArrayData *)auStack_fa0._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)auStack_fa0._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)auStack_fa0._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)auStack_fa0._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)auStack_fa0._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_fb8._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_fb8._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_fb8._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_fb8._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_fb8._8_8_,2,0x10);
    }
  }
  if (pQVar26 != (QArrayData *)0x0) {
    LOCK();
    (pQVar26->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar26->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar26->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar26,2,0x10);
    }
  }
  if (&(local_f78.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_f78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_f78.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_f78.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_f78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_f78.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_f40.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f40.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f40.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_f40.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_f40.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_f40.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f40.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f40.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_f40.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_f40.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_f08.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f08.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f08.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_f08.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_f08.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_f08.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f08.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f08.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_f08.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_f08.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_ed0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_ed0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_ed0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_ed0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_ed0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_ed0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_ed0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_ed0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_ed0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_ed0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_e98.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e98.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e98.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_e98.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_e98.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_e98.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e98.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e98.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_e98.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_e98.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_e60.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e60.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e60.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_e60.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_e60.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_e60.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e60.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e60.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_e60.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_e60.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_e28.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e28.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e28.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_e28.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_e28.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_e28.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e28.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e28.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_e28.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_e28.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_df0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_df0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_df0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_df0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_df0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_df0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_df0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_df0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_df0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_df0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QArrayData *)auStack_da0._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)auStack_da0._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)auStack_da0._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)auStack_da0._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)auStack_da0._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_db8._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_db8._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_db8._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_db8._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_db8._8_8_,2,0x10);
    }
  }
  if (pQVar25 != (QArrayData *)0x0) {
    LOCK();
    (pQVar25->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar25->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar25->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar25,2,0x10);
    }
  }
  if (&(local_d78.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_d78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_d78.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_d78.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_d78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_d78.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_d40.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d40.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d40.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_d40.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_d40.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_d40.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d40.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d40.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_d40.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_d40.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_d08.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d08.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d08.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_d08.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_d08.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_d08.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d08.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d08.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_d08.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_d08.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_cd0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_cd0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_cd0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_cd0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_cd0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_cd0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_cd0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_cd0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_cd0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_cd0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QArrayData *)auStack_c80._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)auStack_c80._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)auStack_c80._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)auStack_c80._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)auStack_c80._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_c98._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_c98._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_c98._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_c98._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_c98._8_8_,2,0x10);
    }
  }
  if (pQVar24 != (QArrayData *)0x0) {
    LOCK();
    (pQVar24->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar24->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar24->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar24,2,0x10);
    }
  }
  if ((QArrayData *)local_c48._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_c48._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_c48._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_c48._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_c48._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_c60._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_c60._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_c60._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_c60._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_c60._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_c10._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_c10._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_c10._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_c10._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_c10._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_c28._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_c28._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_c28._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_c28._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_c28._8_8_,2,0x10);
    }
  }
  if (&(local_bf0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_bf0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_bf0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_bf0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_bf0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_bf0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_bf0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_bf0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_bf0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_bf0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_bb8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_bb8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_bb8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_bb8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_bb8.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_bb8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_bb8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_bb8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_bb8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_bb8.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QArrayData *)local_b68._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_b68._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_b68._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_b68._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_b68._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_b80._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_b80._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_b80._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_b80._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_b80._8_8_,2,0x10);
    }
  }
  if (&(local_b28.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b28.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b28.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_b28.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_b28.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_b28.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b28.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b28.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_b28.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_b28.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_b48);
  if (&(local_af0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_af0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_af0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_af0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_af0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_af0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_af0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_af0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_af0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_af0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QArrayData *)local_aa0._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_aa0._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_aa0._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_aa0._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_aa0._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_ab8._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_ab8._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_ab8._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_ab8._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_ab8._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_a68._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_a68._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_a68._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_a68._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_a68._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_a80._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_a80._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_a80._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_a80._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_a80._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)auStack_a30._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)auStack_a30._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)auStack_a30._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)auStack_a30._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)auStack_a30._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_a48._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_a48._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_a48._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_a48._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_a48._8_8_,2,0x10);
    }
  }
  if (pQVar23 != (QArrayData *)0x0) {
    LOCK();
    (pQVar23->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar23->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar23->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar23,2,0x10);
    }
  }
  if ((QArrayData *)auStack_9f0._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)auStack_9f0._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)auStack_9f0._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)auStack_9f0._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)auStack_9f0._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_a08._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_a08._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_a08._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_a08._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_a08._8_8_,2,0x10);
    }
  }
  if (pQVar22 != (QArrayData *)0x0) {
    LOCK();
    (pQVar22->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar22->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar22->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar22,2,0x10);
    }
  }
  if (&(local_9d0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_9d0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_9d0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_9d0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_9d0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_9d0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_9d0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_9d0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_9d0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_9d0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_998.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_998.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_998.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_998.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_998.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_998.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_998.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_998.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_998.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_998.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_960.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_960.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_960.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_960.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_960.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_960.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_960.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_960.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_960.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_960.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QArrayData *)local_910._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_910._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_910._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_910._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_910._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_928._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_928._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_928._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_928._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_928._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_8d8._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_8d8._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_8d8._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_8d8._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_8d8._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_8f0._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_8f0._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_8f0._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_8f0._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_8f0._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_8a0._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_8a0._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_8a0._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_8a0._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_8a0._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_8b8._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_8b8._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_8b8._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_8b8._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_8b8._8_8_,2,0x10);
    }
  }
  if (&(local_880.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_880.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_880.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_880.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_880.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_880.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_880.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_880.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_880.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_880.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_848.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_848.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_848.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_848.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_848.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_848.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_848.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_848.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_848.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_848.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_810.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_810.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_810.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_810.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_810.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_810.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_810.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_810.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_810.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_810.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QArrayData *)auStack_7c0._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)auStack_7c0._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)auStack_7c0._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)auStack_7c0._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)auStack_7c0._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_7d8._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_7d8._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_7d8._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_7d8._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_7d8._8_8_,2,0x10);
    }
  }
  if (pQVar21 != (QArrayData *)0x0) {
    LOCK();
    (pQVar21->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar21->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar21->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar21,2,0x10);
    }
  }
  if (&(local_798.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_798.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_798.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_798.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_798.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_798.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_798.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_798.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_798.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_798.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_760.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_760.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_760.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_760.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_760.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_760.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_760.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_760.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_760.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_760.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_728.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_728.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_728.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_728.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_728.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_728.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_728.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_728.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_728.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_728.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_6f0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_6f0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_6f0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_6f0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_6f0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_6f0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_6f0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_6f0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_6f0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_6f0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_6b8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_6b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_6b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_6b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_6b8.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_6b8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_6b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_6b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_6b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_6b8.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_680.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_680.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_680.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_680.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_680.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_680.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_680.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_680.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_680.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_680.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QArrayData *)auStack_630._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)auStack_630._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)auStack_630._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)auStack_630._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)auStack_630._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_648._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_648._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_648._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_648._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_648._8_8_,2,0x10);
    }
  }
  if (pQVar20 != (QArrayData *)0x0) {
    LOCK();
    (pQVar20->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar20->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar20->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar20,2,0x10);
    }
  }
  if (&(local_610.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_610.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_610.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_610.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_610.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_610.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_610.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_610.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_610.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_610.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QArrayData *)auStack_5c0._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)auStack_5c0._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)auStack_5c0._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)auStack_5c0._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)auStack_5c0._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_5d8._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_5d8._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_5d8._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_5d8._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_5d8._8_8_,2,0x10);
    }
  }
  if (pQVar19 != (QArrayData *)0x0) {
    LOCK();
    (pQVar19->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar19->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar19->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar19,2,0x10);
    }
  }
  if (&(local_5a0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_5a0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_5a0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_5a0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_5a0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_5a0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_5a0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_5a0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_5a0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_5a0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QArrayData *)auStack_550._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)auStack_550._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)auStack_550._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)auStack_550._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)auStack_550._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_568._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_568._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_568._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_568._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_568._8_8_,2,0x10);
    }
  }
  if (pQVar18 != (QArrayData *)0x0) {
    LOCK();
    (pQVar18->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar18->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar18->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar18,2,0x10);
    }
  }
  if ((QArrayData *)local_518._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_518._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_518._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_518._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_518._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_530._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_530._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_530._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_530._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_530._8_8_,2,0x10);
    }
  }
  if (&(local_4f8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_4f8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_4f8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_4f8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_4f8.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_4f8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_4f8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_4f8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_4f8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_4f8.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_4c0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_4c0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_4c0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_4c0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_4c0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_4c0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_4c0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_4c0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_4c0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_4c0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QArrayData *)auStack_470._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)auStack_470._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)auStack_470._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)auStack_470._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)auStack_470._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_488._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_488._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_488._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_488._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_488._8_8_,2,0x10);
    }
  }
  if (pQVar17 != (QArrayData *)0x0) {
    LOCK();
    (pQVar17->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar17->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar17->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar17,2,0x10);
    }
  }
  if (&(local_448.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_448.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_448.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_448.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_448.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_448.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_448.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_448.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_448.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_448.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_410.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_410.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_410.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_410.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_410.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_410.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_410.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_410.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_410.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_410.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QArrayData *)auStack_3c0._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)auStack_3c0._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)auStack_3c0._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)auStack_3c0._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)auStack_3c0._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_3d8._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_3d8._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_3d8._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_3d8._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_3d8._8_8_,2,0x10);
    }
  }
  if (pQVar16 != (QArrayData *)0x0) {
    LOCK();
    (pQVar16->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar16->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar16->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar16,2,0x10);
    }
  }
  if (&(local_398.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_398.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_398.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_398.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_398.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_398.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_398.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_398.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_398.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_398.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_360.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_360.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_360.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_360.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_360.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_360.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_360.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_360.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_360.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_360.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QArrayData *)auStack_310._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)auStack_310._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)auStack_310._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)auStack_310._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)auStack_310._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_328._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_328._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_328._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_328._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_328._8_8_,2,0x10);
    }
  }
  if (pQVar15 != (QArrayData *)0x0) {
    LOCK();
    (pQVar15->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar15->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar15->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar15,2,0x10);
    }
  }
  if ((QArrayData *)auStack_2d0._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)auStack_2d0._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)auStack_2d0._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)auStack_2d0._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)auStack_2d0._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_2e8._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_2e8._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_2e8._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_2e8._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_2e8._8_8_,2,0x10);
    }
  }
  if (pQVar14 != (QArrayData *)0x0) {
    LOCK();
    (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar14->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar14,2,0x10);
    }
  }
  if ((QArrayData *)auStack_290._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)auStack_290._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)auStack_290._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)auStack_290._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)auStack_290._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_2a8._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_2a8._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_2a8._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_2a8._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_2a8._8_8_,2,0x10);
    }
  }
  if (pQVar13 != (QArrayData *)0x0) {
    LOCK();
    (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar13->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar13,2,0x10);
    }
  }
  if (&(local_270.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_270.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_270.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_270.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_270.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_270.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_270.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_270.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_270.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_270.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QArrayData *)local_220._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_220._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_220._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_220._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_220._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_238._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_238._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_238._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_238._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_238._8_8_,2,0x10);
    }
  }
  if (&(local_200.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_200.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_200.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_200.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_200.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_200.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_200.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_200.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_200.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_200.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QArrayData *)auStack_1b0._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)auStack_1b0._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)auStack_1b0._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)auStack_1b0._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)auStack_1b0._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_1c8._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_1c8._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_1c8._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_1c8._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_1c8._8_8_,2,0x10);
    }
  }
  if (pQVar12 != (QArrayData *)0x0) {
    LOCK();
    (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar12->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar12,2,0x10);
    }
  }
  if ((QArrayData *)auStack_170._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)auStack_170._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)auStack_170._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)auStack_170._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)auStack_170._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_188._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_188._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_188._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_188._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_188._8_8_,2,0x10);
    }
  }
  if (pQVar11 != (QArrayData *)0x0) {
    LOCK();
    (pQVar11->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar11->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar11->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar11,2,0x10);
    }
  }
  if ((QArrayData *)local_138._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_138._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_138._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_138._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_138._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_150._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_150._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_150._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_150._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_150._8_8_,2,0x10);
    }
  }
  if (&(local_118.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_118.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_118.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_118.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_118.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_118.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_118.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_118.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_118.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_118.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_e0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_e0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_e0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_e0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if (((local_e0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_e0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_a8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_a8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_a8.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_a8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if (((local_a8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_a8.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QArrayData *)local_70._32_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_70._32_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_70._32_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_70._32_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_70._32_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_70._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_70._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_70._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_70._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_70._8_8_,2,0x10);
    }
  }
  if (pQVar4 != (QArrayData *)0x0) {
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar4,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void VCXProjectWriter::write(XmlOutput &xml, const VCCLCompilerTool &tool)
{
    xml
        << tag(_CLCompile)
            << attrTagX(_AdditionalIncludeDirectories, tool.AdditionalIncludeDirectories, ";")
            << attrTagX(_AdditionalOptions, tool.AdditionalOptions, " ")
            << attrTagX(_AdditionalUsingDirectories, tool.AdditionalUsingDirectories, ";")
            << attrTagS(_AssemblerListingLocation, tool.AssemblerListingLocation)
            << attrTagS(_AssemblerOutput, toString(tool.AssemblerOutput))
            << attrTagS(_BasicRuntimeChecks, toString(tool.BasicRuntimeChecks))
            << attrTagT(_BrowseInformation, toTriState(tool.BrowseInformation))
            << attrTagS(_BrowseInformationFile, tool.BrowseInformationFile)
            << attrTagT(_BufferSecurityCheck, tool.BufferSecurityCheck)
            << attrTagS(_CallingConvention, toString(tool.CallingConvention))
            << attrTagS(_CompileAs, toString(tool.CompileAs))
            << attrTagS(_CompileAsManaged, toString(tool.CompileAsManaged))
            << attrTagT(_CompileAsWinRT, tool.CompileAsWinRT)
            << attrTagT(_CreateHotpatchableImage, tool.CreateHotpatchableImage)
            << attrTagS(_DebugInformationFormat, toString(tool.DebugInformationFormat,
                                                          tool.config->CompilerVersion))
            << attrTagT(_DisableLanguageExtensions, tool.DisableLanguageExtensions)
            << attrTagX(_DisableSpecificWarnings, tool.DisableSpecificWarnings, ";")
            << attrTagS(_EnableEnhancedInstructionSet, toString(tool.EnableEnhancedInstructionSet))
            << attrTagT(_EnableFiberSafeOptimizations, tool.EnableFiberSafeOptimizations)
            << attrTagT(_EnablePREfast, tool.EnablePREfast)
            << attrTagS(_ErrorReporting, tool.ErrorReporting)
            << attrTagS(_ExceptionHandling, toString(tool.ExceptionHandling))
            << attrTagT(_ExpandAttributedSource, tool.ExpandAttributedSource)
            << attrTagS(_FavorSizeOrSpeed, toString(tool.FavorSizeOrSpeed))
            << attrTagT(_FloatingPointExceptions, tool.FloatingPointExceptions)
            << attrTagS(_FloatingPointModel, toString(tool.FloatingPointModel))
            << attrTagT(_ForceConformanceInForLoopScope, tool.ForceConformanceInForLoopScope)
            << attrTagX(_ForcedIncludeFiles, tool.ForcedIncludeFiles, ";")
            << attrTagX(_ForcedUsingFiles, tool.ForcedUsingFiles, ";")
            << attrTagT(_FunctionLevelLinking, tool.EnableFunctionLevelLinking)
            << attrTagT(_GenerateXMLDocumentationFiles, tool.GenerateXMLDocumentationFiles)
            << attrTagT(_IgnoreStandardIncludePath, tool.IgnoreStandardIncludePath)
            << attrTagS(_InlineFunctionExpansion, toString(tool.InlineFunctionExpansion))
            << attrTagT(_IntrinsicFunctions, tool.EnableIntrinsicFunctions)
            << attrTagT(_MinimalRebuild, tool.MinimalRebuild)
            << attrTagT(_MultiProcessorCompilation, tool.MultiProcessorCompilation)
            << attrTagS(_LanguageStandard, tool.LanguageStandard)
            << attrTagS(_LanguageStandard_C, tool.LanguageStandard_C)
            << attrTagS(_ObjectFileName, tool.ObjectFile)
            << attrTagT(_OmitDefaultLibName, tool.OmitDefaultLibName)
            << attrTagT(_OmitFramePointers, tool.OmitFramePointers)
            << attrTagT(_OpenMPSupport, tool.OpenMP)
            << attrTagS(_Optimization, toString(tool.Optimization))
            << attrTagS(_PrecompiledHeader, toString(tool.UsePrecompiledHeader))
            << attrTagS(_PrecompiledHeaderFile, tool.PrecompiledHeaderThrough)
            << attrTagS(_PrecompiledHeaderOutputFile, tool.PrecompiledHeaderFile)
            << attrTagT(_PreprocessKeepComments, tool.KeepComments)
            << attrTagX(_PreprocessorDefinitions, unquote(tool.PreprocessorDefinitions), ";")
            << attrTagS(_PreprocessOutputPath, tool.PreprocessOutputPath)
            << attrTagT(_PreprocessSuppressLineNumbers, tool.PreprocessSuppressLineNumbers)
            << attrTagT(_PreprocessToFile, toTriState(tool.GeneratePreprocessedFile))
            << fixedProgramDataBaseFileNameOutput(tool)
            << attrTagS(_ProcessorNumber, tool.MultiProcessorCompilationProcessorCount)
            << attrTagS(_RuntimeLibrary, toString(tool.RuntimeLibrary))
            << attrTagT(_RuntimeTypeInfo, tool.RuntimeTypeInfo)
            << attrTagT(_ShowIncludes, tool.ShowIncludes)
            << attrTagT(_SmallerTypeCheck, tool.SmallerTypeCheck)
            << attrTagT(_StringPooling, tool.StringPooling)
            << attrTagS(_StructMemberAlignment, toString(tool.StructMemberAlignment))
            << attrTagT(_SuppressStartupBanner, tool.SuppressStartupBanner)
            << attrTagX(_TreatSpecificWarningsAsErrors, tool.TreatSpecificWarningsAsErrors, ";")
            << attrTagT(_TreatWarningAsError, tool.WarnAsError)
            << attrTagT(_TreatWChar_tAsBuiltInType, tool.TreatWChar_tAsBuiltInType)
            << attrTagT(_UndefineAllPreprocessorDefinitions, tool.UndefineAllPreprocessorDefinitions)
            << attrTagX(_UndefinePreprocessorDefinitions, tool.UndefinePreprocessorDefinitions, ";")
            << attrTagT(_UseFullPaths, tool.DisplayFullPaths)
            << attrTagT(_UseUnicodeForAssemblerListing, tool.UseUnicodeForAssemblerListing)
            << attrTagS(_WarningLevel, toString(tool.WarningLevel))
            << attrTagT(_WholeProgramOptimization, tool.WholeProgramOptimization)
            << attrTagS(_XMLDocumentationFileName, tool.XMLDocumentationFileName)
        << closetag(_CLCompile);
}